

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

int mbedtls_asn1_get_bitstring(uchar **p,uchar *end,mbedtls_asn1_bitstring *bs)

{
  int ret;
  mbedtls_asn1_bitstring *bs_local;
  uchar *end_local;
  uchar **p_local;
  
  p_local._4_4_ = mbedtls_asn1_get_tag(p,end,&bs->len,3);
  if (p_local._4_4_ == 0) {
    if (bs->len == 0) {
      p_local._4_4_ = -0x60;
    }
    else {
      bs->len = bs->len - 1;
      bs->unused_bits = **p;
      if (bs->unused_bits < 8) {
        *p = *p + 1;
        bs->p = *p;
        *p = *p + bs->len;
        if (*p == end) {
          p_local._4_4_ = 0;
        }
        else {
          p_local._4_4_ = -0x66;
        }
      }
      else {
        p_local._4_4_ = -100;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_get_bitstring( unsigned char **p, const unsigned char *end,
                        mbedtls_asn1_bitstring *bs)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /* Certificate type is a single byte bitstring */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &bs->len, MBEDTLS_ASN1_BIT_STRING ) ) != 0 )
        return( ret );

    /* Check length, subtract one for actual bit string length */
    if( bs->len < 1 )
        return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );
    bs->len -= 1;

    /* Get number of unused bits, ensure unused bits <= 7 */
    bs->unused_bits = **p;
    if( bs->unused_bits > 7 )
        return( MBEDTLS_ERR_ASN1_INVALID_LENGTH );
    (*p)++;

    /* Get actual bitstring */
    bs->p = *p;
    *p += bs->len;

    if( *p != end )
        return( MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}